

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall
CppGenerator::registerDependentComputationToLoops(CppGenerator *this,size_t depth,size_t group_id)

{
  TreeDecomposition *this_00;
  pointer pvVar1;
  size_t *psVar2;
  pointer pvVar3;
  pointer pAVar4;
  pointer ppVar5;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var6;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var7;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var8;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var9;
  var_bitset relationBag;
  ulong uVar10;
  var_bitset varOrderBitset;
  _WordT *p_Var11;
  AggregateTuple *depAgg;
  pointer pbVar12;
  View *pVVar13;
  TDNode *pTVar14;
  size_t sVar15;
  size_t sVar16;
  pointer pAVar17;
  long lVar18;
  ulong *puVar19;
  pointer ppVar20;
  ulong *puVar21;
  ProductAggregate *prodAgg;
  size_t *psVar22;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  byte bVar23;
  dyn_bitset contributingViews;
  size_t maxDepth;
  dyn_bitset addedOutLoops;
  dyn_bitset consideredLoops;
  pair<unsigned_long,_unsigned_long> prevAgg;
  DependentLoop depLoop;
  prod_bitset presentFunctions;
  _Base_bitset<24UL> in_stack_fffffffffffffb58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_3a0;
  size_t local_380;
  dyn_bitset local_378;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_358;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_338;
  _WordT local_318;
  _WordT _Stack_310;
  dyn_bitset local_308;
  prod_bitset local_2e8;
  DependentLoop local_228;
  ulong local_f0 [24];
  
  bVar23 = 0;
  pbVar12 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  local_380 = (long)this->groupVariableOrder[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)this->groupVariableOrder[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVVar13 = QueryCompiler::getView
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,*(this->viewGroups).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[group_id].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  pTVar14 = TreeDecomposition::getRelation(this_00,(ulong)pVVar13->_origin);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::_M_erase_at_end
            (&this->depListOfLoops,
             (this->depListOfLoops).
             super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
             super__Vector_impl_data._M_start);
  sVar15 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_338,sVar15 + 1,0,(allocator<unsigned_long> *)&local_228);
  sVar15 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  DependentLoop::DependentLoop(&local_228,sVar15);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_228.loopFactors.m_bits,&local_338.m_bits);
  local_228.loopFactors.m_num_bits = local_338.m_num_bits;
  local_228.loopVariable =
       QueryCompiler::numberOfViews
                 ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
            (&this->depListOfLoops,&local_228);
  pvVar1 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = *(pointer *)
            ((long)&pvVar1[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (psVar22 = pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; psVar22 != psVar2; psVar22 = psVar22 + 1)
  {
    sVar15 = *psVar22;
    if (this->viewLevelRegister[sVar15] == depth) {
      memset(local_f0,0,0xc0);
      sVar16 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_3a0,sVar16 + 1,0,(allocator<unsigned_long> *)&local_2e8);
      sVar16 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_358,sVar16 + 1,0,(allocator<unsigned_long> *)&local_2e8);
      pvVar3 = (this->aggregateComputation).
               super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar4 = *(pointer *)
                ((long)&pvVar3[sVar15].
                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (pAVar17 = pvVar3[sVar15].
                     super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                     super__Vector_impl_data._M_start; pAVar17 != pAVar4; pAVar17 = pAVar17 + 1) {
        lVar18 = 0;
        do {
          puVar19 = (ulong *)((long)&(pAVar17->dependentProdAgg).product.super__Base_bitset<24UL> +
                             lVar18 * 8);
          uVar10 = puVar19[1];
          local_f0[lVar18] = local_f0[lVar18] | *puVar19;
          local_f0[lVar18 + 1] = local_f0[lVar18 + 1] | uVar10;
          lVar18 = lVar18 + 2;
        } while (lVar18 != 0x18);
        ppVar5 = *(pointer *)
                  ((long)&(pAVar17->dependentProdAgg).viewAggregate.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  + 8);
        for (ppVar20 = (pAVar17->dependentProdAgg).viewAggregate.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar5;
            ppVar20 = ppVar20 + 1) {
          local_3a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start[ppVar20->first >> 6] =
               local_3a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[ppVar20->first >> 6] |
               1L << ((byte)ppVar20->first & 0x3f);
        }
      }
      relationBag.super__Base_bitset<2UL>._M_w =
           *(_Base_bitset<2UL> *)(pTVar14->_bag).super__Base_bitset<2UL>._M_w;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_378.m_bits,&local_3a0.m_bits);
      local_378.m_num_bits = local_3a0.m_num_bits;
      local_318 = (pbVar12->super__Base_bitset<2UL>)._M_w[0];
      _Stack_310 = (pbVar12->super__Base_bitset<2UL>)._M_w[1];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_308.m_bits,&local_358.m_bits);
      local_308.m_num_bits = local_358.m_num_bits;
      puVar19 = local_f0;
      puVar21 = (ulong *)&stack0xfffffffffffffb58;
      for (lVar18 = 0x18; lVar18 != 0; lVar18 = lVar18 + -1) {
        *puVar21 = *puVar19;
        puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
        puVar21 = puVar21 + (ulong)bVar23 * -2 + 1;
      }
      varOrderBitset.super__Base_bitset<2UL>._M_w[1] = _Stack_310;
      varOrderBitset.super__Base_bitset<2UL>._M_w[0] = local_318;
      computeDependentLoops
                (&local_2e8,this,sVar15,(prod_bitset)in_stack_fffffffffffffb58._M_w,relationBag,
                 &local_378,varOrderBitset,&local_308,0);
      if (local_308.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_308.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_378.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_378.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_358.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_3a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3a0.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear(&this->localProductList);
  p_Var6 = &((this->localProductMap).
             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var7 = &((this->localProductMap).
             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_01 = p_Var6;
  if (p_Var7 != p_Var6) {
    do {
      std::
      _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != p_Var7);
    (this->localProductMap).
    super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6;
  }
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize(&this->localProductList,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize(&this->localProductMap,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear(&this->newAggregateRegister);
  p_Var8 = &((this->aggregateRegisterMap).
             super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var9 = &((this->aggregateRegisterMap).
             super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_02 = p_Var8;
  if (p_Var9 != p_Var8) {
    do {
      std::
      _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != p_Var9);
    (this->aggregateRegisterMap).
    super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var8;
  }
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize(&this->newAggregateRegister,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(&this->aggregateRegisterMap,
           ((long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->depListOfLoops).
                  super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97);
  pvVar1 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = *(pointer *)
            ((long)&pvVar1[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (psVar22 = pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; psVar22 != psVar2; psVar22 = psVar22 + 1)
  {
    sVar15 = *psVar22;
    if (this->viewLevelRegister[sVar15] == depth) {
      pvVar3 = (this->aggregateComputation).
               super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar17 = pvVar3[sVar15].super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar4 = *(pointer *)
                ((long)&pvVar3[sVar15].
                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (pAVar17 != pAVar4) {
        p_Var11 = (_WordT *)
                  ((long)&(pAVar17->dependentComputation).product.super__Base_bitset<24UL> + 0xa8);
        do {
          local_3a0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_2e8.super__Base_bitset<24UL>._M_w[0] =
               ((long)(this->depListOfLoops).
                      super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->depListOfLoops).
                      super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97;
          local_2e8.super__Base_bitset<24UL>._M_w[1] = 0;
          addDependentProductToLoop
                    (this,(ProductAggregate *)(p_Var11 + 7),sVar15,(size_t *)&local_3a0,&local_380,
                     (pair<unsigned_long,_unsigned_long> *)&local_2e8);
          p_Var11[0x24] = local_2e8.super__Base_bitset<24UL>._M_w[0];
          p_Var11[0x25] = local_2e8.super__Base_bitset<24UL>._M_w[1];
          pAVar17 = (pointer)(p_Var11 + 0x27);
          p_Var11 = p_Var11 + 0x47;
        } while (pAVar17 != pAVar4);
      }
    }
  }
  if (local_228.loopFactors.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.loopFactors.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.outView.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.outView.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.next.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.next.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.functionMask.
      super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.functionMask.
                    super__Vector_base<std::pair<unsigned_long,_std::bitset<1500UL>_>,_std::allocator<std::pair<unsigned_long,_std::bitset<1500UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CppGenerator::registerDependentComputationToLoops(size_t depth, size_t group_id)
{
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    const size_t maxDepth = groupVariableOrder[group_id].size();
    const var_bitset& relationBag =
        _td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin)->_bag;

    depListOfLoops.clear();


    dyn_bitset consideredLoops(_qc->numberOfViews()+1);

    // add empty loop to the list of dependentLoops
    DependentLoop depLoop(_qc->numberOfViews());
    depLoop.loopFactors = consideredLoops;
    depLoop.loopVariable = _qc->numberOfViews();
    
    depListOfLoops.push_back(depLoop);

    // Go over each view that can be outputted at this depth 
    for (const size_t viewID : viewGroups[group_id])
    {
        if (viewLevelRegister[viewID] == depth)
        {
            // go through the ProductAggregates and find functions computed here 
            prod_bitset presentFunctions;
            dyn_bitset contributingViews(_qc->numberOfViews()+1);
            dyn_bitset addedOutLoops(_qc->numberOfViews()+1);

            // Check for all aggregates of that view what dependent computation
            // it requires
            for (const AggregateTuple& depAgg : aggregateComputation[viewID])
            {
                presentFunctions |= depAgg.dependentProdAgg.product;
                for (const auto& p : depAgg.dependentProdAgg.viewAggregate)
                    contributingViews.set(p.first);
            }

            
            // Compute the loops for the dependent computation of this
            // output view
            computeDependentLoops(viewID,presentFunctions,relationBag,contributingViews,
                                  varOrderBitset,addedOutLoops,0);
        }
    }

    // reset the List and Maps for aggregates
    localProductList.clear();
    localProductMap.clear();
    localProductList.resize(depListOfLoops.size());
    localProductMap.resize(depListOfLoops.size());
    
    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    newAggregateRegister.resize(depListOfLoops.size());
    aggregateRegisterMap.resize(depListOfLoops.size());


    // add the aggregates needed for views outputted at this level to the loops
    for (const size_t viewID : viewGroups[group_id])
    {
        if (viewLevelRegister[viewID] == depth)
        {
            for (AggregateTuple& depAgg : aggregateComputation[viewID])
            {
                ProductAggregate& prodAgg = depAgg.dependentProdAgg;

                size_t currentLoop = 0;
                std::pair<size_t, size_t> prevAgg = {depListOfLoops.size(), 0};
                
                addDependentProductToLoop(
                    prodAgg, viewID, currentLoop, maxDepth, prevAgg);

                prodAgg.correspondingLoopAgg = prevAgg;
            }
        }
    }
}